

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O2

value_type * __thiscall
pstore::index::
hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
::load_leaf_node(value_type *__return_storage_ptr__,
                hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *this,database *db,address addr)

{
  value_type local_30;
  
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  ::load_leaf_node(&local_30,&this->map_,db,addr);
  __return_storage_ptr__->field_2 = local_30.first.field_2;
  __return_storage_ptr__->db_ = local_30.first.db_;
  __return_storage_ptr__->is_pointer_ = local_30.first.is_pointer_;
  *(undefined7 *)&__return_storage_ptr__->field_0x9 = local_30.first._9_7_;
  return __return_storage_ptr__;
}

Assistant:

value_type load_leaf_node (database const & db, address const addr) const {
                return map_.load_leaf_node (db, addr).first;
            }